

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int __thiscall Parser::getTokenPrecedence(Parser *this)

{
  Token *this_00;
  TokenType TVar1;
  OperatorChar OVar2;
  int iVar3;
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  size_type sVar4;
  _Map_base<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_02;
  mapped_type *this_03;
  undefined8 extraout_RAX;
  Parser *this_04;
  OperatorChar op;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [64];
  
  this_00 = &this->mCurrentToken;
  TVar1 = Token::type(this_00);
  if ((TVar1 != OPERATOR) && (TVar1 = Token::type(this_00), TVar1 != TWO_CHAR_OPERATOR)) {
    return -1;
  }
  OVar2 = anon_unknown.dwarf_76052::tokenAsOperator(this_00);
  op._0_2_ = OVar2._0_2_;
  op.mOp2 = OVar2.mOp2;
  this_01 = &CalculationEngine::binaryOperators(this->mCalcEngine)->_M_h;
  sVar4 = std::
          _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(this_01,&op);
  if (sVar4 != 0) {
    this_02 = (_Map_base<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)CalculationEngine::binaryOperators(this->mCalcEngine);
    this_03 = std::__detail::
              _Map_base<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at(this_02,&op);
    iVar3 = Operator::precedence(this_03);
    return iVar3;
  }
  OperatorChar::toString_abi_cxx11_((string *)(local_50 + 0x20),&op);
  std::operator+(&local_70,"\'",(string *)(local_50 + 0x20));
  this_04 = (Parser *)local_50;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_04,
                 &local_70,"\' is not a defined binary operator.");
  parseError(this_04,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)(local_50 + 0x20));
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int Parser::getTokenPrecedence() {
	if (mCurrentToken.type() != TokenType::OPERATOR && mCurrentToken.type() != TokenType::TWO_CHAR_OPERATOR) {
		return -1;
	}

	auto op = tokenAsOperator(mCurrentToken);
	if (mCalcEngine.binaryOperators().count(op) > 0) {
		return mCalcEngine.binaryOperators().at(op).precedence();
	} else {
		parseError("'" + op.toString() + "' is not a defined binary operator.");
	}

	return -1;
}